

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Err * parse(VM *vm,int pkg,char *path,char *code)

{
  int iVar1;
  Local *__ptr;
  Parser psr;
  FnScope local_b0;
  Parser local_98;
  
  local_98.vm = vm;
  lex_new(&local_98.lxr,vm,path,code);
  local_98.scope = (FnScope *)0x0;
  local_98.locals_count = 0;
  local_98.locals_capacity = 0x10;
  local_98.pkg = pkg;
  __ptr = (Local *)malloc(0x80);
  vm->err = (Err *)0x0;
  local_98.locals = __ptr;
  iVar1 = _setjmp((__jmp_buf_tag *)vm->guard);
  if (iVar1 == 0) {
    lex_next(&local_98.lxr);
    local_b0.fn = (local_98.vm)->pkgs[local_98.pkg].main_fn;
    local_98.scope = &local_b0;
    local_b0.first_local = 0;
    local_b0.next_slot = 0;
    local_b0.outer_scope = (fn_scope *)0x0;
    parse_block(&local_98);
    fn_emit((local_98.vm)->fns + (local_98.scope)->fn,0x20);
    local_98.scope = (FnScope *)0x0;
    __ptr = local_98.locals;
  }
  free(__ptr);
  return vm->err;
}

Assistant:

Err * parse(VM *vm, int pkg, char *path, char *code) {
	Parser psr = psr_new(vm, pkg, path, code);

	// Set up an error guard
	vm->err = NULL;
	if (!setjmp(vm->guard)) {
		parse_code(&psr);
	}

	psr_free(&psr);
	return vm->err;
}